

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponsePdu.cpp
# Opt level: O0

int __thiscall DIS::ActionResponsePdu::getMarshalledSize(ActionResponsePdu *this)

{
  pointer pEVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  pointer pEVar8;
  const_reference pvVar9;
  undefined1 local_78 [8];
  VariableDatum listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  FixedDatum listElement;
  unsigned_long_long idx;
  int marshalSize;
  ActionResponsePdu *this_local;
  
  iVar3 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  iVar4 = EntityID::getMarshalledSize(&this->_originatingID);
  iVar5 = EntityID::getMarshalledSize(&this->_receivingID);
  idx._4_4_ = iVar3 + iVar4 + iVar5 + 0x10;
  listElement._fixedDatumID = 0;
  listElement._fixedDatumValue = 0;
  while( true ) {
    uVar2 = listElement._8_8_;
    sVar6 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatums);
    if (sVar6 <= (ulong)uVar2) break;
    pvVar7 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatums,listElement._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar7);
    iVar3 = FixedDatum::getMarshalledSize((FixedDatum *)local_30);
    idx._4_4_ = idx._4_4_ + iVar3;
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._variableDatums.
  super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pEVar1 = listElement_1._variableDatums.
             super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pEVar8 = (pointer)std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                                (&this->_variableDatums);
    if (pEVar8 <= pEVar1) break;
    pvVar9 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatums,
                        (size_type)
                        listElement_1._variableDatums.
                        super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar9);
    iVar3 = VariableDatum::getMarshalledSize((VariableDatum *)local_78);
    idx._4_4_ = idx._4_4_ + iVar3;
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    listElement_1._variableDatums.
    super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(listElement_1._variableDatums.
                           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_EightByteChunk
                  + 1);
  }
  return idx._4_4_;
}

Assistant:

int ActionResponsePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _originatingID.getMarshalledSize();  // _originatingID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _requestStatus
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatums.size(); idx++)
   {
        FixedDatum listElement = _fixedDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatums.size(); idx++)
   {
        VariableDatum listElement = _variableDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}